

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Gl_Window.cxx
# Opt level: O1

int __thiscall Fl_Gl_Window::mode(Fl_Gl_Window *this,int m,int *a)

{
  uint uVar1;
  Fl_Gl_Choice *pFVar2;
  int iVar3;
  int *aa;
  int *piVar4;
  Fl_Gl_Choice *pFVar5;
  
  uVar1 = *(uint *)&(this->super_Fl_Window).field_0xec;
  if ((uVar1 != m) || (iVar3 = 0, this->alist != a)) {
    piVar4 = a;
    if (a != (int *)0x0) {
      do {
        iVar3 = *piVar4;
        if (iVar3 == 0) goto LAB_001bc3bd;
        piVar4 = piVar4 + 1;
      } while (iVar3 != 5);
      m = m | 2;
    }
LAB_001bc3bd:
    pFVar2 = this->g;
    if (-1 < (int)uVar1 && this->context_ != (GLXContext)0x0) {
      fl_delete_gl_context(this->context_);
    }
    this->context_ = (GLXContext)0x0;
    *(int *)&(this->super_Fl_Window).field_0xec = m;
    this->alist = a;
    if ((this->super_Fl_Window).i == (Fl_X *)0x0) {
      this->g = (Fl_Gl_Choice *)0x0;
    }
    else {
      pFVar5 = Fl_Gl_Choice::find(m,a);
      this->g = pFVar5;
      if (((pFVar5 != (Fl_Gl_Choice *)0x0) && (pFVar5->vis->visualid == pFVar2->vis->visualid)) &&
         (((m ^ uVar1) & 2) == 0)) {
        return 1;
      }
      (*(this->super_Fl_Window).super_Fl_Group.super_Fl_Widget._vptr_Fl_Widget[6])(this);
      (*(this->super_Fl_Window).super_Fl_Group.super_Fl_Widget._vptr_Fl_Widget[5])(this);
    }
    iVar3 = 1;
  }
  return iVar3;
}

Assistant:

int Fl_Gl_Window::mode(int m, const int *a) {
  if (m == mode_ && a == alist) return 0;
#ifndef __APPLE__
  int oldmode = mode_;
#endif
#if defined(__APPLE__) || defined(USE_X11)
  if (a) { // when the mode is set using the a array of system-dependent values, and if asking for double buffer,
           // the FL_DOUBLE flag must be set in the mode_ member variable
    const int *aa = a;
    while (*aa) {
      if (*(aa++) ==
#  if defined(__APPLE__)
          kCGLPFADoubleBuffer
#  else
          GLX_DOUBLEBUFFER
#  endif
          ) { m |= FL_DOUBLE; break; }
    }
  }
#endif // !__APPLE__
#if !defined(WIN32) && !defined(__APPLE__)
  Fl_Gl_Choice* oldg = g;
#endif // !WIN32 && !__APPLE__
  context(0);
  mode_ = m; alist = a;
  if (shown()) {
    g = Fl_Gl_Choice::find(m, a);

#if defined(USE_X11)
    // under X, if the visual changes we must make a new X window (yuck!):
    if (!g || g->vis->visualid!=oldg->vis->visualid || (oldmode^m)&FL_DOUBLE) {
      hide();
      show();
    }
#elif defined(WIN32)
    if (!g || (oldmode^m)&(FL_DOUBLE|FL_STEREO)) {
      hide();
      show();
    }
#elif defined(__APPLE_QUARTZ__)
    redraw();
#else
#  error unsupported platform
#endif
  } else {
    g = 0;
  }
  return 1;
}